

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# PlayerStrategy.cpp
# Opt level: O3

void __thiscall PlayerStrategy::PlayerStrategy(PlayerStrategy *this,Player *player)

{
  string *psVar1;
  pointer pcVar2;
  int *piVar3;
  string *psVar4;
  
  this->_vptr_PlayerStrategy = (_func_int **)&PTR___cxa_pure_virtual_0013c8c8;
  piVar3 = (int *)operator_new(4);
  *piVar3 = -1;
  this->numWeakest = piVar3;
  piVar3 = (int *)operator_new(4);
  *piVar3 = 0;
  this->exchangingCardType = piVar3;
  piVar3 = (int *)operator_new(4);
  *piVar3 = 0;
  this->armiesToPlace = piVar3;
  this->player = player;
  this->from = (Country *)0x0;
  this->to = (Country *)0x0;
  psVar4 = (string *)operator_new(0x20);
  psVar1 = player->strategy->strategyName;
  (psVar4->_M_dataplus)._M_p = (pointer)&psVar4->field_2;
  pcVar2 = (psVar1->_M_dataplus)._M_p;
  std::__cxx11::string::_M_construct<char*>
            ((string *)psVar4,pcVar2,pcVar2 + psVar1->_M_string_length);
  this->strategyName = psVar4;
  return;
}

Assistant:

PlayerStrategy::PlayerStrategy(Player* player) {
    this->exchangingCardType = new int(0);
    this->armiesToPlace = new int(0);
    this->player = player;
    this->from = nullptr;
    this->to = nullptr;
    this->strategyName = new std::string(player->getStrategy()->getStrategyName());
}